

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

char * raptor_strdup(char *src)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (src != (char *)0x0) {
    sVar1 = strlen(src);
    __dest = raptor::Malloc(sVar1 + 1);
    pcVar2 = (char *)memcpy(__dest,src,sVar1 + 1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char* raptor_strdup(const char* src) {
    char* dst;
    size_t len;

    if (!src) {
        return nullptr;
    }

    len = strlen(src) + 1;
    dst = static_cast<char*>(raptor::Malloc(len));

    memcpy(dst, src, len);
    return dst;
}